

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgproperty.cpp
# Opt level: O3

bool __thiscall lunasvg::SVGAngle::parse(SVGAngle *this,string_view input)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  byte *pbVar4;
  long lVar5;
  byte *pbVar6;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float value;
  float local_24;
  string_view local_20;
  
  pbVar6 = (byte *)input._M_str;
  local_20._M_len = input._M_len;
  local_20._M_str = (char *)pbVar6;
  if (local_20._M_len == 0) goto LAB_0011f1b0;
  local_20._M_str = (char *)(pbVar6 + local_20._M_len);
  lVar5 = -local_20._M_len;
  pbVar4 = pbVar6;
  do {
    if ((0x20 < (ulong)*pbVar4) || ((0x100002600U >> ((ulong)*pbVar4 & 0x3f) & 1) == 0)) {
      lVar7 = 0;
      goto LAB_0011f22b;
    }
    pbVar4 = pbVar4 + 1;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0);
  goto LAB_0011f1a7;
  while (bVar2 = lVar5 + 1 != lVar7, lVar7 = lVar7 + -1, bVar2) {
LAB_0011f22b:
    local_20._M_str = (char *)pbVar4;
    if ((0x20 < (ulong)pbVar6[lVar7 + (local_20._M_len - 1)]) ||
       ((0x100002600U >> ((ulong)pbVar6[lVar7 + (local_20._M_len - 1)] & 0x3f) & 1) == 0)) {
      local_20._M_len = lVar7 - lVar5;
      if (local_20._M_len == 0x12) {
        auVar8[0] = -(*pbVar4 == 'a');
        auVar8[1] = -(pbVar4[1] == 'u');
        auVar8[2] = -(pbVar4[2] == 't');
        auVar8[3] = -(pbVar4[3] == 'o');
        auVar8[4] = -(pbVar4[4] == '-');
        auVar8[5] = -(pbVar4[5] == 's');
        auVar8[6] = -(pbVar4[6] == 't');
        auVar8[7] = -(pbVar4[7] == 'a');
        auVar8[8] = -(pbVar4[8] == 'r');
        auVar8[9] = -(pbVar4[9] == 't');
        auVar8[10] = -(pbVar4[10] == '-');
        auVar8[0xb] = -(pbVar4[0xb] == 'r');
        auVar8[0xc] = -(pbVar4[0xc] == 'e');
        auVar8[0xd] = -(pbVar4[0xd] == 'v');
        auVar8[0xe] = -(pbVar4[0xe] == 'e');
        auVar8[0xf] = -(pbVar4[0xf] == 'r');
        auVar9[0] = -((char)*(undefined2 *)(pbVar4 + 0x10) == 's');
        auVar9[1] = -((char)((ushort)*(undefined2 *)(pbVar4 + 0x10) >> 8) == 'e');
        auVar9[2] = 0xff;
        auVar9[3] = 0xff;
        auVar9[4] = 0xff;
        auVar9[5] = 0xff;
        auVar9[6] = 0xff;
        auVar9[7] = 0xff;
        auVar9[8] = 0xff;
        auVar9[9] = 0xff;
        auVar9[10] = 0xff;
        auVar9[0xb] = 0xff;
        auVar9[0xc] = 0xff;
        auVar9[0xd] = 0xff;
        auVar9[0xe] = 0xff;
        auVar9[0xf] = 0xff;
        auVar9 = auVar9 & auVar8;
        if ((ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar9[0xf] >> 7) << 0xf) == 0xffff) {
          *(undefined8 *)&(this->super_SVGProperty).field_0xc = 0x100000000;
          return true;
        }
      }
      else if ((local_20._M_len == 4) && (*(int *)pbVar4 == 0x6f747561)) {
        *(undefined8 *)&(this->super_SVGProperty).field_0xc = 0;
        return true;
      }
      goto LAB_0011f1b0;
    }
  }
LAB_0011f1a7:
  local_20._M_len = 0;
LAB_0011f1b0:
  local_24 = 0.0;
  bVar2 = parseNumber<float>(&local_20,&local_24);
  pcVar1 = local_20._M_str;
  if (!bVar2) {
    return false;
  }
  if (local_20._M_len != 0) {
    if (local_20._M_len == 4) {
      iVar3 = bcmp(local_20._M_str,"grad",4);
      if (iVar3 == 0) {
        local_24 = local_24 * 0.9;
      }
      else {
        if (*(int *)pcVar1 != 0x6e727574) {
          return false;
        }
        local_24 = local_24 * 360.0;
      }
    }
    else {
      if (local_20._M_len != 3) {
        return false;
      }
      if (local_20._M_str[2] == 100 && *(short *)local_20._M_str == 0x6172) {
        local_24 = local_24 * 57.295776;
      }
      else {
        iVar3 = bcmp(local_20._M_str,"deg",3);
        if (iVar3 != 0) {
          return false;
        }
      }
    }
  }
  *(float *)&(this->super_SVGProperty).field_0xc = local_24;
  this->m_orientType = Angle;
  return true;
}

Assistant:

bool SVGAngle::parse(std::string_view input)
{
    stripLeadingAndTrailingSpaces(input);
    if(input == "auto") {
        m_value = 0.f;
        m_orientType = OrientType::Auto;
        return true;
    }

    if(input == "auto-start-reverse") {
        m_value = 0.f;
        m_orientType = OrientType::AutoStartReverse;
        return true;
    }

    float value = 0.f;
    if(!parseNumber(input, value))
        return false;
    if(!input.empty()) {
        if(input == "rad")
            value *= 180.f / PLUTOVG_PI;
        else if(input == "grad")
            value *= 360.f / 400.f;
        else if(input == "turn")
            value *= 360.f;
        else if(input != "deg") {
            return false;
        }
    }

    m_value = value;
    m_orientType = OrientType::Angle;
    return true;
}